

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall spvtools::opt::analysis::Array::IsSameImpl(Array *this,Type *that,IsSameCache *seen)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x18])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    iVar2 = (*this->element_type_->_vptr_Type[2])
                      (this->element_type_,*(undefined8 *)(lVar3 + 0x28),seen);
    if ((char)iVar2 != '\0') {
      bVar1 = analysis::Type::HasSameDecorations(&this->super_Type,that);
      if (bVar1) {
        bVar1 = std::operator==(&(this->length_info_).words,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (lVar3 + 0x38));
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool Array::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Array* at = that->AsArray();
  if (!at) return false;
  bool is_same = element_type_->IsSameImpl(at->element_type_, seen);
  is_same = is_same && HasSameDecorations(that);
  is_same = is_same && (length_info_.words == at->length_info_.words);
  return is_same;
}